

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

ostream * duckdb_parquet::operator<<(ostream *out,type *val)

{
  type tVar1;
  char *__s;
  size_t sVar2;
  long lVar3;
  long lVar4;
  
  tVar1 = *val;
  lVar3 = 0x2536da0;
  if (_Type_VALUES_TO_NAMES._16_8_ != 0) {
    lVar3 = 0x2536da0;
    lVar4 = _Type_VALUES_TO_NAMES._16_8_;
    do {
      if ((int)tVar1 <= *(int *)(lVar4 + 0x20)) {
        lVar3 = lVar4;
      }
      lVar4 = *(long *)(lVar4 + 0x10 + (ulong)(*(int *)(lVar4 + 0x20) < (int)tVar1) * 8);
    } while (lVar4 != 0);
  }
  lVar4 = 0x2536da0;
  if ((lVar3 != 0x2536da0) && (lVar4 = 0x2536da0, *(int *)(lVar3 + 0x20) <= (int)tVar1)) {
    lVar4 = lVar3;
  }
  if (lVar4 == 0x2536da0) {
    std::ostream::operator<<(out,tVar1);
  }
  else {
    __s = *(char **)(lVar4 + 0x28);
    if (__s == (char *)0x0) {
      std::ios::clear((int)out + (int)*(undefined8 *)(*(long *)out + -0x18));
    }
    else {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,__s,sVar2);
    }
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Type::type& val) {
  std::map<int, const char*>::const_iterator it = _Type_VALUES_TO_NAMES.find(val);
  if (it != _Type_VALUES_TO_NAMES.end()) {
    out << it->second;
  } else {
    out << static_cast<int>(val);
  }
  return out;
}